

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

vector<std::complex<double>,_std::allocator<std::complex<double>_>_> * __thiscall
helics::helicsGetComplexVector
          (vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
           *__return_storage_ptr__,helics *this,string_view val)

{
  string_view val_00;
  
  (__return_storage_ptr__->
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  val_00._M_str = (char *)val._M_len;
  val_00._M_len = (size_t)this;
  helicsGetComplexVector(val_00,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::complex<double>> helicsGetComplexVector(std::string_view val)
{
    std::vector<std::complex<double>> vectorVal;
    helicsGetComplexVector(val, vectorVal);
    return vectorVal;
}